

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O1

void __thiscall
FMD3Model::RenderFrame
          (FMD3Model *this,FTexture *skin,int frameno,int frameno2,double inter,int translation)

{
  int iVar1;
  MD3Surface *pMVar2;
  bool bVar3;
  FMaterial *this_00;
  uint uVar4;
  long lVar5;
  long lVar6;
  FTexture *tex;
  
  if (frameno2 < this->numFrames && frameno < this->numFrames) {
    gl_RenderState.mInterpolationFactor = (float)inter;
    bVar3 = 0 < this->numSurfaces;
    if (0 < this->numSurfaces) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        pMVar2 = this->surfaces;
        tex = skin;
        if (skin == (FTexture *)0x0) {
          uVar4 = ((this->super_FModel).curSpriteMDLFrame)->surfaceskinIDs
                  [(this->super_FModel).curMDLIndex][lVar6].texnum;
          if ((int)uVar4 < 1) {
            if ((*(int *)((long)&pMVar2->numSkins + lVar5) < 1) ||
               (uVar4 = **(uint **)((long)&pMVar2->skins + lVar5), (int)uVar4 < 1))
            goto LAB_0046351f;
            tex = (FTexture *)0x0;
            if (uVar4 < TexMan.Textures.Count) goto LAB_00463501;
          }
          else if (uVar4 < TexMan.Textures.Count) {
LAB_00463501:
            tex = TexMan.Textures.Array[TexMan.Translation.Array[uVar4]].Texture;
          }
          else {
LAB_0046351f:
            tex = (FTexture *)0x0;
          }
          if (tex == (FTexture *)0x0) {
            if (bVar3) {
              return;
            }
            break;
          }
        }
        this_00 = FMaterial::ValidateTexture(tex,false);
        gl_RenderState.mEffectState = this_00->mShaderIndex;
        gl_RenderState.mShaderTimer = (this_00->tex->gl_info).shaderspeed;
        FMaterial::Bind(this_00,0,translation);
        FRenderState::Apply(&gl_RenderState);
        uVar4 = *(uint *)((long)&pMVar2->numVertices + lVar5);
        iVar1 = *(int *)((long)&pMVar2->vindex + lVar5);
        FModelVertexBuffer::SetupFrame
                  ((this->super_FModel).mVBuf,uVar4 * frameno + iVar1,uVar4 * frameno2 + iVar1,uVar4
                  );
        (*_ptrc_glDrawElements)
                  (4,*(int *)((long)&pMVar2->numTriangles + lVar5) * 3,0x1405,
                   (void *)((ulong)*(uint *)((long)&pMVar2->iindex + lVar5) << 2));
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x38;
        bVar3 = lVar6 < this->numSurfaces;
      } while (lVar6 < this->numSurfaces);
    }
    gl_RenderState.mInterpolationFactor = 0.0;
  }
  return;
}

Assistant:

void FMD3Model::RenderFrame(FTexture * skin, int frameno, int frameno2, double inter, int translation)
{
	if (frameno>=numFrames || frameno2>=numFrames) return;

	gl_RenderState.SetInterpolationFactor((float)inter);
	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * surf = &surfaces[i];

		// [BB] In case no skin is specified via MODELDEF, check if the MD3 has a skin for the current surface.
		// Note: Each surface may have a different skin.
		FTexture *surfaceSkin = skin;
		if (!surfaceSkin)
		{
			if (curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i].isValid())
			{
				surfaceSkin = TexMan(curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i]);
			}
			else if(surf->numSkins > 0 && surf->skins[0].isValid())
			{
				surfaceSkin = TexMan(surf->skins[0]);
			}

			if (!surfaceSkin) return;
		}

		FMaterial * tex = FMaterial::ValidateTexture(surfaceSkin, false);

		gl_RenderState.SetMaterial(tex, CLAMP_NONE, translation, -1, false);

		gl_RenderState.Apply();
		mVBuf->SetupFrame(surf->vindex + frameno * surf->numVertices, surf->vindex + frameno2 * surf->numVertices, surf->numVertices);
		glDrawElements(GL_TRIANGLES, surf->numTriangles * 3, GL_UNSIGNED_INT, (void*)(intptr_t)(surf->iindex * sizeof(unsigned int)));
	}
	gl_RenderState.SetInterpolationFactor(0.f);
}